

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>,slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>const&>
          (BumpAllocator *this,SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *args)

{
  SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *pSVar1;
  SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pSVar1 = (SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *)
           allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>::SeparatedSyntaxList
            (in_RSI,pSVar1);
  return pSVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }